

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O3

void __thiscall HEkk::initialiseEkk(HEkk *this)

{
  pointer pHVar1;
  
  if ((this->status_).initialised_for_new_lp == false) {
    setSimplexOptions(this);
    initialiseControl(this);
    initialiseSimplexLpRandomVectors(this);
    HSimplexNla::clear(&this->simplex_nla_);
    pHVar1 = (this->bad_basis_change_).
             super__Vector_base<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->bad_basis_change_).
        super__Vector_base<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
        ._M_impl.super__Vector_impl_data._M_finish != pHVar1) {
      (this->bad_basis_change_).
      super__Vector_base<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
      ._M_impl.super__Vector_impl_data._M_finish = pHVar1;
    }
    (this->status_).initialised_for_new_lp = true;
  }
  return;
}

Assistant:

void HEkk::initialiseEkk() {
  if (status_.initialised_for_new_lp) return;
  setSimplexOptions();
  initialiseControl();
  initialiseSimplexLpRandomVectors();
  simplex_nla_.clear();
  clearBadBasisChange();
  status_.initialised_for_new_lp = true;
}